

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPartialLine.hpp
# Opt level: O2

void njoy::ENDFtk::record::Zipper::
     readPartialLine<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Real>,std::tuple<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,0ul>
               (long nEntries,long *iteratorTuple,
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *end,long *lineNumber,int MAT,int MF,int MT)

{
  long lVar1;
  undefined8 *puVar2;
  uint64_t offset;
  long lVar3;
  double dVar4;
  undefined4 in_stack_ffffffffffffffb8;
  
  for (lVar3 = 0; nEntries != lVar3; lVar3 = lVar3 + 1) {
    lVar1 = *iteratorTuple;
    dVar4 = tools::disco::Real<11u>::
            read<double,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(it,end);
    *(double *)(lVar1 + lVar3 * 8) = dVar4;
  }
  nEntries = nEntries + -7;
  do {
    nEntries = nEntries + 1;
    if (nEntries == 0) {
      verifyTail<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (it,end,lineNumber,MAT,MF,MT);
      return;
    }
    dVar4 = tools::disco::Real<11u>::
            read<double,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(it,end);
  } while ((dVar4 == 0.0) && (!NAN(dVar4)));
  tools::Log::error<char_const*>((char *)CONCAT44(MF,in_stack_ffffffffffffffb8));
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
readPartialLine
( uint64_t nEntries, Tuple& iteratorTuple, Iterator& it, const Iterator& end,
  long& lineNumber, int MAT, int MF, int MT,
  std::index_sequence< indices... > ){

  using namespace njoy::tools;

//auto increment = []( uint64_t offset, auto& iterator ){ iterator+= offset; };

  for ( uint64_t offset = 0; offset < nEntries; ++offset ){
    Zip::TupleFormat::read
      ( it, end, std::get< indices >( iteratorTuple )[offset]... );
  }

  auto remainingEntries = Zip::tuplesPerRecord - nEntries;
  std::tuple< typename Zip:: template Type< indices >... > leftovers;

  while ( remainingEntries-- ){
    Zip::TupleFormat::read( it, end, std::get< indices >( leftovers )... );
    if ( leftovers != Zip::defaultTuple() ){
      Log::error( "Encountered non-default value where none was expected" );
      throw std::exception();
    }
  }

  using Gap = disco::Record
              < disco::Column< Zip::nPad >, disco::RetainCarriage >;

  Gap::read( it, end );

  verifyTail( it, end, lineNumber, MAT, MF, MT );
}